

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBLumaColorTableRow_C
               (uint8_t *src_argb,uint8_t *dst_argb,int width,uint8_t *luma,uint32_t lumacoeff)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint8_t *luma0_1;
  uint8_t *luma1;
  uint8_t *luma0;
  int i;
  uint32_t rc;
  uint32_t gc;
  uint32_t bc;
  uint32_t lumacoeff_local;
  uint8_t *luma_local;
  int width_local;
  uint8_t *dst_argb_local;
  uint8_t *src_argb_local;
  
  uVar1 = lumacoeff & 0xff;
  uVar2 = lumacoeff >> 8 & 0xff;
  uVar3 = lumacoeff >> 0x10 & 0xff;
  dst_argb_local = dst_argb;
  src_argb_local = src_argb;
  for (i = 0; i < width + -1; i = i + 2) {
    uVar4 = *src_argb_local * uVar1 + src_argb_local[1] * uVar2 + src_argb_local[2] * uVar3 & 0x7f00
    ;
    *dst_argb_local = luma[(ulong)*src_argb_local + (ulong)uVar4];
    dst_argb_local[1] = luma[(ulong)src_argb_local[1] + (ulong)uVar4];
    dst_argb_local[2] = luma[(ulong)src_argb_local[2] + (ulong)uVar4];
    dst_argb_local[3] = src_argb_local[3];
    uVar4 = src_argb_local[4] * uVar1 + src_argb_local[5] * uVar2 + src_argb_local[6] * uVar3 &
            0x7f00;
    dst_argb_local[4] = luma[(ulong)src_argb_local[4] + (ulong)uVar4];
    dst_argb_local[5] = luma[(ulong)src_argb_local[5] + (ulong)uVar4];
    dst_argb_local[6] = luma[(ulong)src_argb_local[6] + (ulong)uVar4];
    dst_argb_local[7] = src_argb_local[7];
    src_argb_local = src_argb_local + 8;
    dst_argb_local = dst_argb_local + 8;
  }
  if ((width & 1U) != 0) {
    uVar1 = *src_argb_local * uVar1 + src_argb_local[1] * uVar2 + src_argb_local[2] * uVar3 & 0x7f00
    ;
    *dst_argb_local = luma[(ulong)*src_argb_local + (ulong)uVar1];
    dst_argb_local[1] = luma[(ulong)src_argb_local[1] + (ulong)uVar1];
    dst_argb_local[2] = luma[(ulong)src_argb_local[2] + (ulong)uVar1];
    dst_argb_local[3] = src_argb_local[3];
  }
  return;
}

Assistant:

void ARGBLumaColorTableRow_C(const uint8_t* src_argb,
                             uint8_t* dst_argb,
                             int width,
                             const uint8_t* luma,
                             uint32_t lumacoeff) {
  uint32_t bc = lumacoeff & 0xff;
  uint32_t gc = (lumacoeff >> 8) & 0xff;
  uint32_t rc = (lumacoeff >> 16) & 0xff;

  int i;
  for (i = 0; i < width - 1; i += 2) {
    // Luminance in rows, color values in columns.
    const uint8_t* luma0 =
        ((src_argb[0] * bc + src_argb[1] * gc + src_argb[2] * rc) & 0x7F00u) +
        luma;
    const uint8_t* luma1;
    dst_argb[0] = luma0[src_argb[0]];
    dst_argb[1] = luma0[src_argb[1]];
    dst_argb[2] = luma0[src_argb[2]];
    dst_argb[3] = src_argb[3];
    luma1 =
        ((src_argb[4] * bc + src_argb[5] * gc + src_argb[6] * rc) & 0x7F00u) +
        luma;
    dst_argb[4] = luma1[src_argb[4]];
    dst_argb[5] = luma1[src_argb[5]];
    dst_argb[6] = luma1[src_argb[6]];
    dst_argb[7] = src_argb[7];
    src_argb += 8;
    dst_argb += 8;
  }
  if (width & 1) {
    // Luminance in rows, color values in columns.
    const uint8_t* luma0 =
        ((src_argb[0] * bc + src_argb[1] * gc + src_argb[2] * rc) & 0x7F00u) +
        luma;
    dst_argb[0] = luma0[src_argb[0]];
    dst_argb[1] = luma0[src_argb[1]];
    dst_argb[2] = luma0[src_argb[2]];
    dst_argb[3] = src_argb[3];
  }
}